

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MazeHeap.h
# Opt level: O1

void __thiscall CMazeHeap::Push(CMazeHeap *this,CGrid *pGrid)

{
  int iVar1;
  int iVar2;
  int iVar3;
  CGrid *pCVar4;
  CGrid *pCVar5;
  uint uVar6;
  bool bVar7;
  uint uVar8;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  int iVar13;
  ulong uVar9;
  
  iVar1 = this->m_iSize;
  if (0x27fff < (long)iVar1) {
    __assert_fail("m_iSize<MAX_QUEUE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/MazeHeap.h"
                  ,0xb4,"void CMazeHeap::Push(CGrid *)");
  }
  iVar2 = pGrid->m_iHeapPos;
  uVar12 = (ulong)iVar2;
  if ((long)uVar12 < 0) {
    pGrid->m_iHeapPos = iVar1;
    this->m_iSize = iVar1 + 1;
    m_Queue[iVar1] = pGrid;
    if (iVar1 == 0) {
      return;
    }
    iVar2 = pGrid->m_iMazePCost;
    iVar13 = iVar1;
    do {
      iVar11 = (iVar13 - (iVar13 + -1 >> 0x1f)) + -1 >> 1;
      pCVar4 = m_Queue[iVar11];
      iVar3 = pCVar4->m_iMazePCost;
      if (iVar2 < iVar3) {
        pCVar5 = m_Queue[iVar13];
        if (iVar13 == iVar11) {
          iVar13 = iVar11;
          if (pCVar5 != pCVar4) goto LAB_00112646;
        }
        else {
          pCVar5->m_iHeapPos = iVar11;
          pCVar4->m_iHeapPos = iVar13;
          m_Queue[iVar13] = pCVar4;
          m_Queue[iVar11] = pCVar5;
          if (m_Queue[iVar13]->m_iHeapPos != iVar13) goto LAB_00112627;
          iVar13 = iVar11;
          if (pCVar5->m_iHeapPos != iVar11) goto LAB_0011256d;
        }
      }
    } while (iVar2 < iVar3);
    if (iVar1 == 0) {
      return;
    }
  }
  else {
    if (m_Queue[uVar12] != pGrid) {
      __assert_fail("pGrid==m_Queue[pGrid->m_iHeapPos]",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/MazeHeap.h"
                    ,0xcb,"void CMazeHeap::Push(CGrid *)");
    }
    iVar13 = pGrid->m_iMazePCost;
    if ((iVar2 == 0) ||
       (m_Queue[(uint)((iVar2 - (iVar2 + -1 >> 0x1f)) + -1 >> 1)]->m_iMazePCost <= iVar13)) {
      if (iVar1 == 0) {
        return;
      }
      do {
        uVar6 = (uint)uVar12;
        uVar10 = uVar6 * 2 + 1;
        uVar8 = uVar6 * 2 + 2;
        if ((int)uVar8 < iVar1 && (int)uVar10 < iVar1) {
          if (m_Queue[uVar10]->m_iMazePCost < m_Queue[uVar8]->m_iMazePCost) {
            if (iVar13 <= m_Queue[uVar10]->m_iMazePCost) goto LAB_00112528;
            pCVar4 = m_Queue[(int)uVar6];
            uVar8 = uVar10;
            if (uVar6 == uVar10) {
              bVar7 = true;
              if (pCVar4 != m_Queue[uVar10]) goto LAB_00112646;
            }
            else {
              pCVar4->m_iHeapPos = uVar10;
              pCVar5 = m_Queue[uVar10];
              pCVar5->m_iHeapPos = uVar6;
              m_Queue[(int)uVar6] = pCVar5;
              m_Queue[uVar10] = pCVar4;
              if (m_Queue[(int)uVar6]->m_iHeapPos != uVar6) goto LAB_00112627;
              bVar7 = true;
              if (pCVar4->m_iHeapPos != uVar10) goto LAB_0011256d;
            }
          }
          else {
            if (iVar13 <= m_Queue[uVar8]->m_iMazePCost) goto LAB_00112528;
            pCVar4 = m_Queue[(int)uVar6];
            if (uVar6 == uVar8) {
              bVar7 = true;
              if (pCVar4 != m_Queue[uVar8]) goto LAB_00112646;
            }
            else {
              pCVar4->m_iHeapPos = uVar8;
              pCVar5 = m_Queue[uVar8];
              pCVar5->m_iHeapPos = uVar6;
              m_Queue[(int)uVar6] = pCVar5;
              m_Queue[uVar8] = pCVar4;
              if (m_Queue[(int)uVar6]->m_iHeapPos != uVar6) goto LAB_00112627;
              bVar7 = true;
              if (pCVar4->m_iHeapPos != uVar8) goto LAB_0011256d;
            }
          }
        }
        else {
          if (((int)uVar10 < iVar1) && (m_Queue[uVar10]->m_iMazePCost < iVar13)) {
            pCVar4 = m_Queue[(int)uVar6];
            if (uVar6 == uVar10) {
              if (pCVar4 != m_Queue[uVar10]) goto LAB_00112646;
            }
            else {
              pCVar4->m_iHeapPos = uVar10;
              pCVar5 = m_Queue[uVar10];
              pCVar5->m_iHeapPos = uVar6;
              m_Queue[(int)uVar6] = pCVar5;
              m_Queue[uVar10] = pCVar4;
              if (m_Queue[(int)uVar6]->m_iHeapPos != uVar6) goto LAB_00112627;
              if (pCVar4->m_iHeapPos != uVar10) goto LAB_0011256d;
            }
          }
LAB_00112528:
          bVar7 = false;
          uVar8 = uVar6;
        }
        uVar12 = (ulong)uVar8;
      } while (bVar7);
    }
    else {
      do {
        uVar6 = (uint)uVar12;
        uVar8 = (int)((uVar6 - ((int)(uVar6 - 1) >> 0x1f)) + -1) >> 1;
        uVar9 = (ulong)uVar8;
        iVar1 = m_Queue[uVar9]->m_iMazePCost;
        if (iVar13 < iVar1) {
          pCVar4 = m_Queue[(int)uVar6];
          if (uVar6 == uVar8) {
            if (pCVar4 != m_Queue[(int)uVar8]) {
LAB_00112646:
              __assert_fail("m_Queue[iPos1]==m_Queue[iPos2]",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/MazeHeap.h"
                            ,0x72,"void CMazeHeap::Swab(int, int)");
            }
          }
          else {
            pCVar4->m_iHeapPos = uVar8;
            pCVar5 = m_Queue[(int)uVar8];
            pCVar5->m_iHeapPos = uVar6;
            m_Queue[(int)uVar6] = pCVar5;
            m_Queue[(int)uVar8] = pCVar4;
            if (m_Queue[(int)uVar6]->m_iHeapPos != uVar6) {
LAB_00112627:
              __assert_fail("m_Queue[iPos1]->m_iHeapPos==iPos1",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/MazeHeap.h"
                            ,0x7d,"void CMazeHeap::Swab(int, int)");
            }
            if (pCVar4->m_iHeapPos != uVar8) {
LAB_0011256d:
              __assert_fail("m_Queue[iPos2]->m_iHeapPos==iPos2",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/MazeHeap.h"
                            ,0x7e,"void CMazeHeap::Swab(int, int)");
            }
          }
        }
        else {
          uVar9 = uVar12 & 0xffffffff;
        }
        uVar12 = uVar9;
      } while (iVar13 < iVar1);
    }
  }
  if (m_Queue[pGrid->m_iHeapPos] == pGrid) {
    return;
  }
  __assert_fail("pGrid==m_Queue[pGrid->m_iHeapPos]",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/MazeHeap.h"
                ,0x106,"void CMazeHeap::Push(CGrid *)");
}

Assistant:

void Push(CGrid* pGrid)
	{
		assert(m_iSize<MAX_QUEUE);
		if(pGrid->m_iHeapPos<0)
		{
			int	iCurPos			=	m_iSize;
			pGrid->m_iHeapPos	=	iCurPos;

			m_Queue[m_iSize++]	=	pGrid;

			int	iCurCost	=	pGrid->GetHeapCost();

			if(iCurPos==0)	return;

			while(TRUE)
			{
				int	iParPos		=	(iCurPos-1)/2;

				if(iCurCost>=m_Queue[iParPos]->GetHeapCost())	break;			
				Swab(iCurPos,iParPos);
				iCurPos	=	iParPos;
			}
		}
		else
		{
			assert(pGrid==m_Queue[pGrid->m_iHeapPos]);
			int	iCurPos		=	pGrid->m_iHeapPos;
			int	iParPos		=	(iCurPos-1)/2;

			int	iCurCost	=	pGrid->GetHeapCost();

			if(iCurPos&&iCurCost<m_Queue[iParPos]->GetHeapCost())
			{
				while(TRUE)
				{
					int	iParPos		=	(iCurPos-1)/2;

					if(iCurCost>=m_Queue[iParPos]->GetHeapCost())	break;
					Swab(iCurPos,iParPos);
					iCurPos	=	iParPos;
				}
			}
			else
			{
				if(m_iSize==0)	return;

				while (TRUE)
				{
					int	iLChildPos	=	iCurPos+iCurPos+1;
					int	iRChildPos	=	iLChildPos+1;

					// both are valid children [2/19/2007 thyeros]
					if(iLChildPos<m_iSize&&iRChildPos<m_iSize)
					{
						int	iLChildCost	=	m_Queue[iLChildPos]->GetHeapCost();
						int	iRChildCost	=	m_Queue[iRChildPos]->GetHeapCost();

						if(iLChildCost<iRChildCost)
						{
							if(iCurCost<=iLChildCost)	break;
							Swab(iCurPos,iLChildPos);
							iCurPos	=	iLChildPos;
						}
						else
						{
							if(iCurCost<=iRChildCost)	break;
							Swab(iCurPos,iRChildPos);
							iCurPos	=	iRChildPos;
						}
					}
					else if(iLChildPos<m_iSize)
					{
						if(iCurCost<=m_Queue[iLChildPos]->GetHeapCost())	break;
						Swab(iCurPos,iLChildPos);
						break;
					}
					else 
					{
						break;
					}
				}
			}
		}

		assert(pGrid==m_Queue[pGrid->m_iHeapPos]);
	}